

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

const_iterator __thiscall
ghc::filesystem::path::iterator::increment(iterator *this,const_iterator *pos)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var4;
  bool local_71;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  bool local_21;
  const_iterator *pcStack_20;
  bool fromStart;
  const_iterator *pos_local;
  iterator *this_local;
  const_iterator i;
  
  this_local = (iterator *)pos->_M_current;
  pcStack_20 = pos;
  pos_local = &this->_first;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this_local,&this->_first);
  local_71 = true;
  if (!bVar1) {
    local_71 = __gnu_cxx::operator==
                         ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&this_local,&this->_prefix);
  }
  local_21 = local_71;
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this_local,&this->_last);
  if (bVar1) {
    if ((((local_21 & 1U) == 0) ||
        (bVar1 = __gnu_cxx::operator==
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&this_local,&this->_first), !bVar1)) ||
       (bVar1 = __gnu_cxx::operator>(&this->_prefix,&this->_first), !bVar1)) {
      local_30 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&this_local,0);
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_30);
      if (*pcVar3 == '/') {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&this_local,&this->_last);
        if ((bVar1) &&
           (pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&this_local), *pcVar3 == '/')) {
          bVar1 = false;
          if ((local_21 & 1U) != 0) {
            local_38 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&this_local,1);
            bVar2 = __gnu_cxx::operator!=(&local_38,&this->_last);
            bVar1 = false;
            if (bVar2) {
              local_40 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&this_local,1);
              pcVar3 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_40);
              bVar1 = *pcVar3 == '/';
            }
            bVar1 = (bool)(bVar1 ^ 1);
          }
          if (bVar1) {
            p_Var4 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&this_local);
            this_local = (iterator *)
                         std::
                         find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                                   ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )p_Var4->_M_current,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(this->_last)._M_current,
                                    "/St15_Sp_counted_ptrIPN3ghc10filesystem28recursive_directory_iterator33recursive_directory_iterator_implELN9__gnu_cxx12_Lock_policyE2EE"
                                   );
          }
          else {
            while( true ) {
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&this_local,&this->_last);
              bVar1 = false;
              if (bVar2) {
                pcVar3 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&this_local);
                bVar1 = *pcVar3 == '/';
              }
              if (!bVar1) break;
              __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&this_local);
            }
          }
        }
      }
      else if ((((local_21 & 1U) == 0) ||
               (bVar1 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&this_local,&this->_last), !bVar1)) ||
              (pcVar3 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&this_local), *pcVar3 != ':')) {
        this_local = (iterator *)
                     std::find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                               ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )this_local,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(this->_last)._M_current,
                                "/St15_Sp_counted_ptrIPN3ghc10filesystem28recursive_directory_iterator33recursive_directory_iterator_implELN9__gnu_cxx12_Lock_policyE2EE"
                               );
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this_local);
      }
    }
    else {
      this_local = (iterator *)(this->_prefix)._M_current;
    }
  }
  return (const_iterator)(char *)this_local;
}

Assistant:

GHC_INLINE path::impl_string_type::const_iterator path::iterator::increment(const path::impl_string_type::const_iterator& pos) const
{
    path::impl_string_type::const_iterator i = pos;
    bool fromStart = i == _first || i == _prefix;
    if (i != _last) {
        if (fromStart && i == _first && _prefix > _first) {
            i = _prefix;
        }
        else if (*i++ == preferred_separator) {
            // we can only sit on a slash if it is a network name or a root
            if (i != _last && *i == preferred_separator) {
                if (fromStart && !(i + 1 != _last && *(i + 1) == preferred_separator)) {
                    // leadind double slashes detected, treat this and the
                    // following until a slash as one unit
                    i = std::find(++i, _last, preferred_separator);
                }
                else {
                    // skip redundant slashes
                    while (i != _last && *i == preferred_separator) {
                        ++i;
                    }
                }
            }
        }
        else {
            if (fromStart && i != _last && *i == ':') {
                ++i;
            }
            else {
                i = std::find(i, _last, preferred_separator);
            }
        }
    }
    return i;
}